

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_generateSequences_internal
                 (ldmState_t *ldmState,rawSeqStore_t *rawSeqStore,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  uint uVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  U32 UVar6;
  uint uVar7;
  int iVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  long lVar11;
  int iVar12;
  ZSTD_window_t window;
  ldmEntry_t entry;
  ldmEntry_t entry_00;
  ldmEntry_t entry_01;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  U32 UVar19;
  uint uVar20;
  U32 UVar21;
  BYTE *pMatchBase;
  BYTE *pInLimit;
  size_t sVar22;
  XXH64_hash_t XVar23;
  ldmEntry_t *plVar24;
  rawSeq *prVar25;
  undefined8 in_stack_fffffffffffffdd0;
  BYTE *local_228;
  BYTE *local_220;
  BYTE *local_218;
  BYTE *local_210;
  BYTE *local_208;
  BYTE *local_200;
  uint local_1f4;
  rawSeq *seq;
  BYTE *pMatch_1;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *pMatch;
  BYTE *curMatchBase;
  size_t curTotalMatchLength;
  size_t curBackwardMatchLength;
  size_t curForwardMatchLength;
  ldmEntry_t newEntry;
  ldmEntry_t *bestEntry;
  ldmEntry_t *cur;
  ldmEntry_t *bucket;
  U32 hash_1;
  U32 checksum;
  BYTE *split_1;
  U32 offset;
  size_t mLength;
  size_t bestMatchLength;
  size_t backwardMatchLength;
  size_t forwardMatchLength;
  U32 hash;
  U64 xxhash;
  BYTE *split;
  uint n;
  size_t hashed;
  ldmMatchCandidate_t *plStack_c0;
  uint numSplits;
  ldmMatchCandidate_t *candidates;
  size_t *splits;
  ldmRollingHashState_t hashState;
  BYTE *ip;
  BYTE *anchor;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *istart;
  BYTE *lowPrefixPtr;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  BYTE *base;
  U32 lowestIndex;
  U32 dictLimit;
  U32 hBits;
  U32 entsPerBucket;
  U32 minMatchLength;
  int extDict;
  size_t srcSize_local;
  void *src_local;
  ldmParams_t *params_local;
  rawSeqStore_t *rawSeqStore_local;
  ldmState_t *ldmState_local;
  
  uVar13 = (ldmState->window).base;
  uVar14 = (ldmState->window).dictBase;
  uVar15 = (ldmState->window).dictLimit;
  uVar16 = (ldmState->window).lowLimit;
  uVar17 = (ldmState->window).nbOverflowCorrections;
  uVar18 = *(undefined4 *)&(ldmState->window).field_0x24;
  window.lowLimit = uVar18;
  window.dictLimit = uVar17;
  window.dictBase._4_4_ = uVar16;
  window.dictBase._0_4_ = uVar15;
  window.base = (BYTE *)uVar14;
  window.nextSrc = (BYTE *)uVar13;
  window._32_8_ = in_stack_fffffffffffffdd0;
  UVar19 = ZSTD_window_hasExtDict(window);
  uVar1 = params->minMatchLength;
  UVar2 = params->bucketSizeLog;
  UVar3 = params->hashLog;
  UVar4 = params->bucketSizeLog;
  uVar5 = (ldmState->window).dictLimit;
  local_1f4 = uVar5;
  if (UVar19 != 0) {
    local_1f4 = (ldmState->window).lowLimit;
  }
  pBVar9 = (ldmState->window).base;
  if (UVar19 == 0) {
    local_200 = (BYTE *)0x0;
    local_208 = (BYTE *)0x0;
    local_210 = (BYTE *)0x0;
  }
  else {
    local_200 = (ldmState->window).dictBase;
    local_208 = local_200 + local_1f4;
    local_210 = local_200 + uVar5;
  }
  pMatchBase = pBVar9 + uVar5;
  pInLimit = (BYTE *)((long)src + srcSize);
  candidates = (ldmMatchCandidate_t *)ldmState->splitIndices;
  plStack_c0 = ldmState->matchCandidates;
  if (srcSize < uVar1) {
    lVar11 = -(long)src;
  }
  else {
    hashState.stopMask = (U64)src;
    ZSTD_ldm_gear_init((ldmRollingHashState_t *)&splits,params);
    ZSTD_ldm_gear_reset((ldmRollingHashState_t *)&splits,(BYTE *)hashState.stopMask,(ulong)uVar1);
    ip = (BYTE *)src;
    for (hashState.stopMask = hashState.stopMask + uVar1; hashState.stopMask < pInLimit + -8;
        hashState.stopMask = sVar22 + hashState.stopMask) {
      hashed._4_4_ = 0;
      sVar22 = ZSTD_ldm_gear_feed((ldmRollingHashState_t *)&splits,(BYTE *)hashState.stopMask,
                                  (long)(pInLimit + -8) - hashState.stopMask,(size_t *)candidates,
                                  (uint *)((long)&hashed + 4));
      for (split._4_4_ = 0; split._4_4_ < hashed._4_4_; split._4_4_ = split._4_4_ + 1) {
        pBVar10 = (&candidates->split)[split._4_4_];
        lVar11 = hashState.stopMask - uVar1;
        XVar23 = XXH64(pBVar10 + lVar11,(ulong)uVar1,0);
        uVar20 = (uint)XVar23 & (1 << ((char)UVar3 - (char)UVar4 & 0x1fU)) - 1U;
        plStack_c0[split._4_4_].split = pBVar10 + lVar11;
        plStack_c0[split._4_4_].hash = uVar20;
        plStack_c0[split._4_4_].checksum = (U32)(XVar23 >> 0x20);
        plVar24 = ZSTD_ldm_getBucket(ldmState,(ulong)uVar20,*params);
        plStack_c0[split._4_4_].bucket = plVar24;
      }
      for (split._4_4_ = 0; split._4_4_ < hashed._4_4_; split._4_4_ = split._4_4_ + 1) {
        backwardMatchLength = 0;
        bestMatchLength = 0;
        mLength = 0;
        pBVar10 = plStack_c0[split._4_4_].split;
        UVar6 = plStack_c0[split._4_4_].checksum;
        uVar20 = plStack_c0[split._4_4_].hash;
        plVar24 = plStack_c0[split._4_4_].bucket;
        newEntry.offset = 0;
        newEntry.checksum = 0;
        iVar12 = (int)pBVar10;
        UVar21 = iVar12 - (int)pBVar9;
        bestEntry = plVar24;
        if (pBVar10 < ip) {
          entry.checksum = UVar6;
          entry.offset = UVar21;
          ZSTD_ldm_insertEntry(ldmState,(ulong)uVar20,entry,*params);
        }
        else {
          for (; bestEntry < plVar24 + (uint)(1 << ((byte)UVar2 & 0x1f)); bestEntry = bestEntry + 1)
          {
            if ((bestEntry->checksum == UVar6) && (local_1f4 < bestEntry->offset)) {
              if (UVar19 == 0) {
                uVar7 = bestEntry->offset;
                curBackwardMatchLength = ZSTD_count(pBVar10,pBVar9 + uVar7,pInLimit);
                if (uVar1 <= curBackwardMatchLength) {
                  curTotalMatchLength =
                       ZSTD_ldm_countBackwardsMatch(pBVar10,ip,pBVar9 + uVar7,pMatchBase);
                  goto LAB_00af903b;
                }
              }
              else {
                local_218 = pBVar9;
                if (bestEntry->offset < uVar5) {
                  local_218 = local_200;
                }
                uVar7 = bestEntry->offset;
                local_220 = pInLimit;
                if (bestEntry->offset < uVar5) {
                  local_220 = local_210;
                }
                local_228 = pMatchBase;
                if (bestEntry->offset < uVar5) {
                  local_228 = local_208;
                }
                curBackwardMatchLength =
                     ZSTD_count_2segments(pBVar10,local_218 + uVar7,pInLimit,local_220,pMatchBase);
                if (uVar1 <= curBackwardMatchLength) {
                  curTotalMatchLength =
                       ZSTD_ldm_countBackwardsMatch_2segments
                                 (pBVar10,ip,local_218 + uVar7,local_228,local_208,local_210);
LAB_00af903b:
                  if (mLength < curBackwardMatchLength + curTotalMatchLength) {
                    backwardMatchLength = curBackwardMatchLength;
                    bestMatchLength = curTotalMatchLength;
                    newEntry = (ldmEntry_t)bestEntry;
                    mLength = curBackwardMatchLength + curTotalMatchLength;
                  }
                }
              }
            }
          }
          if (newEntry == (ldmEntry_t)0x0) {
            entry_00.checksum = UVar6;
            entry_00.offset = UVar21;
            ZSTD_ldm_insertEntry(ldmState,(ulong)uVar20,entry_00,*params);
          }
          else {
            iVar8 = *(int *)newEntry;
            prVar25 = rawSeqStore->seq + rawSeqStore->size;
            if (rawSeqStore->size == rawSeqStore->capacity) {
              return 0xffffffffffffffba;
            }
            prVar25->litLength = (iVar12 - (int)bestMatchLength) - (int)ip;
            prVar25->matchLength = (int)backwardMatchLength + (int)bestMatchLength;
            prVar25->offset = (iVar12 - (int)pBVar9) - iVar8;
            rawSeqStore->size = rawSeqStore->size + 1;
            entry_01.checksum = UVar6;
            entry_01.offset = UVar21;
            ZSTD_ldm_insertEntry(ldmState,(ulong)uVar20,entry_01,*params);
            ip = pBVar10 + backwardMatchLength;
            if ((BYTE *)(hashState.stopMask + sVar22) < ip) {
              ZSTD_ldm_gear_reset((ldmRollingHashState_t *)&splits,ip + -(ulong)uVar1,(ulong)uVar1);
              hashState.stopMask = (long)ip - sVar22;
              break;
            }
          }
        }
      }
    }
    lVar11 = -(long)ip;
  }
  ldmState_local = (ldmState_t *)(pInLimit + lVar11);
  return (size_t)ldmState_local;
}

Assistant:

static size_t ZSTD_ldm_generateSequences_internal(
        ldmState_t* ldmState, rawSeqStore_t* rawSeqStore,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    /* LDM parameters */
    int const extDict = ZSTD_window_hasExtDict(ldmState->window);
    U32 const minMatchLength = params->minMatchLength;
    U32 const entsPerBucket = 1U << params->bucketSizeLog;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    /* Prefix and extDict parameters */
    U32 const dictLimit = ldmState->window.dictLimit;
    U32 const lowestIndex = extDict ? ldmState->window.lowLimit : dictLimit;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const dictBase = extDict ? ldmState->window.dictBase : NULL;
    BYTE const* const dictStart = extDict ? dictBase + lowestIndex : NULL;
    BYTE const* const dictEnd = extDict ? dictBase + dictLimit : NULL;
    BYTE const* const lowPrefixPtr = base + dictLimit;
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    BYTE const* const ilimit = iend - HASH_READ_SIZE;
    /* Input positions */
    BYTE const* anchor = istart;
    BYTE const* ip = istart;
    /* Rolling hash state */
    ldmRollingHashState_t hashState;
    /* Arrays for staged-processing */
    size_t* const splits = ldmState->splitIndices;
    ldmMatchCandidate_t* const candidates = ldmState->matchCandidates;
    unsigned numSplits;

    if (srcSize < minMatchLength)
        return iend - anchor;

    /* Initialize the rolling hash state with the first minMatchLength bytes */
    ZSTD_ldm_gear_init(&hashState, params);
    ZSTD_ldm_gear_reset(&hashState, ip, minMatchLength);
    ip += minMatchLength;

    while (ip < ilimit) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, ilimit - ip,
                                    splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            BYTE const* const split = ip + splits[n] - minMatchLength;
            U64 const xxhash = XXH64(split, minMatchLength, 0);
            U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));

            candidates[n].split = split;
            candidates[n].hash = hash;
            candidates[n].checksum = (U32)(xxhash >> 32);
            candidates[n].bucket = ZSTD_ldm_getBucket(ldmState, hash, *params);
            PREFETCH_L1(candidates[n].bucket);
        }

        for (n = 0; n < numSplits; n++) {
            size_t forwardMatchLength = 0, backwardMatchLength = 0,
                   bestMatchLength = 0, mLength;
            U32 offset;
            BYTE const* const split = candidates[n].split;
            U32 const checksum = candidates[n].checksum;
            U32 const hash = candidates[n].hash;
            ldmEntry_t* const bucket = candidates[n].bucket;
            ldmEntry_t const* cur;
            ldmEntry_t const* bestEntry = NULL;
            ldmEntry_t newEntry;

            newEntry.offset = (U32)(split - base);
            newEntry.checksum = checksum;

            /* If a split point would generate a sequence overlapping with
             * the previous one, we merely register it in the hash table and
             * move on */
            if (split < anchor) {
                ZSTD_ldm_insertEntry(ldmState, hash, newEntry, *params);
                continue;
            }

            for (cur = bucket; cur < bucket + entsPerBucket; cur++) {
                size_t curForwardMatchLength, curBackwardMatchLength,
                       curTotalMatchLength;
                if (cur->checksum != checksum || cur->offset <= lowestIndex) {
                    continue;
                }
                if (extDict) {
                    BYTE const* const curMatchBase =
                        cur->offset < dictLimit ? dictBase : base;
                    BYTE const* const pMatch = curMatchBase + cur->offset;
                    BYTE const* const matchEnd =
                        cur->offset < dictLimit ? dictEnd : iend;
                    BYTE const* const lowMatchPtr =
                        cur->offset < dictLimit ? dictStart : lowPrefixPtr;
                    curForwardMatchLength =
                        ZSTD_count_2segments(split, pMatch, iend, matchEnd, lowPrefixPtr);
                    if (curForwardMatchLength < minMatchLength) {
                        continue;
                    }
                    curBackwardMatchLength = ZSTD_ldm_countBackwardsMatch_2segments(
                            split, anchor, pMatch, lowMatchPtr, dictStart, dictEnd);
                } else { /* !extDict */
                    BYTE const* const pMatch = base + cur->offset;
                    curForwardMatchLength = ZSTD_count(split, pMatch, iend);
                    if (curForwardMatchLength < minMatchLength) {
                        continue;
                    }
                    curBackwardMatchLength =
                        ZSTD_ldm_countBackwardsMatch(split, anchor, pMatch, lowPrefixPtr);
                }
                curTotalMatchLength = curForwardMatchLength + curBackwardMatchLength;

                if (curTotalMatchLength > bestMatchLength) {
                    bestMatchLength = curTotalMatchLength;
                    forwardMatchLength = curForwardMatchLength;
                    backwardMatchLength = curBackwardMatchLength;
                    bestEntry = cur;
                }
            }

            /* No match found -- insert an entry into the hash table
             * and process the next candidate match */
            if (bestEntry == NULL) {
                ZSTD_ldm_insertEntry(ldmState, hash, newEntry, *params);
                continue;
            }

            /* Match found */
            offset = (U32)(split - base) - bestEntry->offset;
            mLength = forwardMatchLength + backwardMatchLength;
            {
                rawSeq* const seq = rawSeqStore->seq + rawSeqStore->size;

                /* Out of sequence storage */
                if (rawSeqStore->size == rawSeqStore->capacity)
                    return ERROR(dstSize_tooSmall);
                seq->litLength = (U32)(split - backwardMatchLength - anchor);
                seq->matchLength = (U32)mLength;
                seq->offset = offset;
                rawSeqStore->size++;
            }

            /* Insert the current entry into the hash table --- it must be
             * done after the previous block to avoid clobbering bestEntry */
            ZSTD_ldm_insertEntry(ldmState, hash, newEntry, *params);

            anchor = split + forwardMatchLength;

            /* If we find a match that ends after the data that we've hashed
             * then we have a repeating, overlapping, pattern. E.g. all zeros.
             * If one repetition of the pattern matches our `stopMask` then all
             * repetitions will. We don't need to insert them all into out table,
             * only the first one. So skip over overlapping matches.
             * This is a major speed boost (20x) for compressing a single byte
             * repeated, when that byte ends up in the table.
             */
            if (anchor > ip + hashed) {
                ZSTD_ldm_gear_reset(&hashState, anchor - minMatchLength, minMatchLength);
                /* Continue the outter loop at anchor (ip + hashed == anchor). */
                ip = anchor - hashed;
                break;
            }
        }

        ip += hashed;
    }

    return iend - anchor;
}